

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_pack(REF_GRID ref_grid)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_EDGE ref_edge;
  REF_INT *local_30;
  REF_INT *local_28;
  REF_EDGE local_20;
  
  uVar1 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar1 == 0) {
    uVar1 = ref_edge_create(&local_20,ref_grid);
    if (uVar1 == 0) {
      uVar1 = ref_edge_rcm(local_20,&local_30,&local_28);
      if (uVar1 == 0) {
        uVar1 = ref_edge_free(local_20);
        if (uVar1 == 0) {
          uVar1 = ref_node_pack(ref_grid->node,local_30,local_28);
          if (uVar1 == 0) {
            for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
              uVar1 = ref_cell_pack(ref_grid->cell[lVar4],local_30);
              if (uVar1 != 0) {
                pcVar3 = "pack cell";
                uVar2 = 0xb0;
                goto LAB_0014fc48;
              }
            }
            uVar1 = ref_geom_pack(ref_grid->geom,local_30);
            if (uVar1 == 0) {
              uVar1 = ref_interp_pack(ref_grid->interp,local_28);
              if (uVar1 == 0) {
                free(local_28);
                free(local_30);
                return 0;
              }
              pcVar3 = "pack interp";
              uVar2 = 0xb6;
            }
            else {
              pcVar3 = "pack geom";
              uVar2 = 0xb4;
            }
          }
          else {
            pcVar3 = "pack node";
            uVar2 = 0xad;
          }
        }
        else {
          pcVar3 = "free edge";
          uVar2 = 0xaa;
        }
      }
      else {
        pcVar3 = "compact";
        uVar2 = 0xa9;
      }
    }
    else {
      pcVar3 = "create edge";
      uVar2 = 0xa8;
    }
  }
  else {
    pcVar3 = "sync globals";
    uVar2 = 0xa6;
  }
LAB_0014fc48:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
         "ref_grid_pack",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_pack(REF_GRID ref_grid) {
  REF_INT group;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_BOOL timing = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync globals");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_edge_rcm(ref_edge, &o2n, &n2o), "compact");
  RSS(ref_edge_free(ref_edge), "free edge");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack rcm");

  RSS(ref_node_pack(ref_grid_node(ref_grid), o2n, n2o), "pack node");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack node");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_pack(ref_cell, o2n), "pack cell");
  }
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack cell");

  RSS(ref_geom_pack(ref_grid_geom(ref_grid), o2n), "pack geom");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack geom");
  RSS(ref_interp_pack(ref_grid_interp(ref_grid), n2o), "pack interp");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack interp");

  ref_free(n2o);
  ref_free(o2n);

  return REF_SUCCESS;
}